

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_instance.c
# Opt level: O0

_Bool al_set_sample(ALLEGRO_SAMPLE_INSTANCE *spl,ALLEGRO_SAMPLE *data)

{
  _Bool _Var1;
  ALLEGRO_SAMPLE_INSTANCE *in_RSI;
  long in_RDI;
  _Bool need_reattach;
  sample_parent_t old_parent;
  _Bool in_stack_ffffffffffffffd7;
  byte bVar2;
  ALLEGRO_SAMPLE_INSTANCE *in_stack_ffffffffffffffd8;
  ALLEGRO_MIXER *in_stack_ffffffffffffffe0;
  _Bool local_1;
  
  if (((*(byte *)(in_RDI + 0xa8) & 1) == 0) ||
     (_Var1 = al_set_sample_instance_playing(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7),
     _Var1)) {
    if (in_RSI == (ALLEGRO_SAMPLE_INSTANCE *)0x0) {
      if (*(long *)(in_RDI + 0xf8) != 0) {
        _al_kcm_detach_from_parent(&in_stack_ffffffffffffffe0->ss);
      }
      *(undefined8 *)(in_RDI + 0x90) = 0;
      local_1 = true;
    }
    else {
      bVar2 = 0;
      if ((*(long *)(in_RDI + 0xf8) != 0) &&
         (((*(int *)(in_RDI + 0x88) != (in_RSI->es).__pad[2] ||
           (*(int *)(in_RDI + 0x80) != (in_RSI->es).__pad[0])) ||
          (*(int *)(in_RDI + 0x84) != (in_RSI->es).__pad[1])))) {
        in_stack_ffffffffffffffe0 = *(ALLEGRO_MIXER **)(in_RDI + 0x100);
        bVar2 = 1;
        _al_kcm_detach_from_parent(&in_stack_ffffffffffffffe0->ss);
      }
      memcpy((void *)(in_RDI + 0x80),in_RSI,0x28);
      *(undefined1 *)(in_RDI + 0x98) = 0;
      *(undefined4 *)(in_RDI + 0xbc) = 0;
      *(undefined4 *)(in_RDI + 0xc4) = 0;
      *(int *)(in_RDI + 200) = (in_RSI->es).__pad[3];
      if ((bVar2 & 1) != 0) {
        if (((ulong)in_stack_ffffffffffffffe0 & 1) == 0) {
          _Var1 = al_attach_sample_instance_to_mixer(in_RSI,in_stack_ffffffffffffffe0);
          if (!_Var1) {
            *(undefined8 *)(in_RDI + 0x90) = 0;
            return false;
          }
        }
        else {
          _Var1 = al_attach_sample_instance_to_voice
                            (in_RSI,(ALLEGRO_VOICE *)in_stack_ffffffffffffffe0);
          if (!_Var1) {
            *(undefined8 *)(in_RDI + 0x90) = 0;
            return false;
          }
        }
      }
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool al_set_sample(ALLEGRO_SAMPLE_INSTANCE *spl, ALLEGRO_SAMPLE *data)
{
   sample_parent_t old_parent;
   bool need_reattach;

   ASSERT(spl);

   /* Stop the sample if it is playing. */
   if (spl->is_playing) {
      if (!al_set_sample_instance_playing(spl, false)) {
         /* Shouldn't happen. */
         ASSERT(false);
         return false;
      }
   }

   if (!data) {
      if (spl->parent.u.ptr) {
         _al_kcm_detach_from_parent(spl);
      }
      spl->spl_data.buffer.ptr = NULL;
      return true;
   }

   /* Have data. */

   need_reattach = false;
   if (spl->parent.u.ptr != NULL) {
      if (spl->spl_data.frequency != data->frequency ||
            spl->spl_data.depth != data->depth ||
            spl->spl_data.chan_conf != data->chan_conf) {
         old_parent = spl->parent;
         need_reattach = true;
         _al_kcm_detach_from_parent(spl);
      }
   }

   spl->spl_data = *data;
   spl->spl_data.free_buf = false;
   spl->pos = 0;
   spl->loop_start = 0;
   spl->loop_end = data->len;
   /* Should we reset the loop mode? */

   if (need_reattach) {
      if (old_parent.is_voice) {
         if (!al_attach_sample_instance_to_voice(spl, old_parent.u.voice)) {
            spl->spl_data.buffer.ptr = NULL;
            return false;
         }
      }
      else {
         if (!al_attach_sample_instance_to_mixer(spl, old_parent.u.mixer)) {
            spl->spl_data.buffer.ptr = NULL;
            return false;
         }
      }
   }

   return true;
}